

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O1

int __thiscall NULLCIO::ReadTextFromConsole(NULLCIO *this,NULLCArray data)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  char buf [2048];
  char local_829 [2057];
  
  if (this == (NULLCIO *)0x0) {
    nullcThrowError("ERROR: argument should not be a nullptr",data.ptr,
                    CONCAT44((int)((ulong)register0x00000010 >> 0x20),data.len));
  }
  else if (readFunc != (code *)0x0) {
    lVar6 = 0;
    local_829[1] = 0;
    local_829[0] = '\0';
    do {
      iVar1 = (*readFunc)(contextFunc,local_829,1);
      if ((iVar1 == 0) || (local_829[0] == '\n')) {
        pcVar2 = local_829 + lVar6 + 1;
        goto LAB_0012659c;
      }
      local_829[lVar6 + 1] = local_829[0];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x7ff);
    pcVar2 = local_829 + 0x800;
LAB_0012659c:
    *pcVar2 = '\0';
    uVar5 = (uint)data.ptr;
    if (uVar5 != 0) {
      sVar3 = strlen(local_829 + 1);
      uVar7 = (int)sVar3 + 1;
      if (uVar7 != 0) {
        uVar4 = uVar7;
        if (uVar5 < uVar7) {
          uVar4 = uVar5;
        }
        memcpy(this,local_829 + 1,(ulong)(uVar4 + (uVar4 == 0)));
      }
      uVar5 = uVar5 - 1;
      this[uVar5] = (NULLCIO)0x0;
      if (uVar7 < uVar5) {
        return uVar7;
      }
      return uVar5;
    }
  }
  return 0;
}

Assistant:

int ReadTextFromConsole(NULLCArray data)
	{
		if(!data.ptr)
		{
			nullcThrowError("ERROR: argument should not be a nullptr");
			return 0;
		}

		if(!readFunc)
			return 0;

		char buf[2048];
		ReadString(buf, 2048);

		if(!data.len)
			return 0;

		unsigned int len = (unsigned int)strlen(buf) + 1;
		char *target = data.ptr;
		for(unsigned int i = 0; i < (data.len < len ? data.len : len); i++)
			target[i] = buf[i];
		target[data.len - 1] = 0;
		
		return ((unsigned int)len < data.len - 1 ? len : data.len - 1);
	}